

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ExceptionInfoResponse>::destruct
          (BasicTypeInfo<dap::ExceptionInfoResponse> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ExceptionInfoResponse> *this_local;
  
  ExceptionInfoResponse::~ExceptionInfoResponse((ExceptionInfoResponse *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }